

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall Liby::TcpServer::TcpServer(TcpServer *this,EventLoop *loop)

{
  Poller *pPVar1;
  EventLoop *loop_local;
  TcpServer *this_local;
  
  TimerMixin::TimerMixin(&this->super_TimerMixin);
  (this->super_TimerMixin)._vptr_TimerMixin = (_func_int **)&PTR__TcpServer_0018ea00;
  this->listenfd_ = -1;
  std::shared_ptr<Liby::Socket>::shared_ptr(&this->socket_);
  pPVar1 = EventLoop::getPoller(loop);
  this->poller_ = pPVar1;
  this->loop_ = loop;
  std::unique_ptr<Liby::Channel,std::default_delete<Liby::Channel>>::
  unique_ptr<std::default_delete<Liby::Channel>,void>
            ((unique_ptr<Liby::Channel,std::default_delete<Liby::Channel>> *)&this->chan_);
  std::function<void_(Liby::Connection_&)>::function(&this->acceptorCallback_);
  std::function<void_(Liby::Connection_&)>::function(&this->readEventCallback_);
  std::function<void_(Liby::Connection_&)>::function(&this->erroEventCallback_);
  return;
}

Assistant:

TcpServer::TcpServer(EventLoop *loop)
    : poller_(loop->getPoller()), loop_(loop) {}